

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int help_monster_out(monst *mtmp,trap *ttmp)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char local_338 [8];
  char kbuf_2 [256];
  char kbuf_1 [256];
  char kbuf [256];
  boolean can_disint;
  boolean udied;
  obj *poStack_30;
  boolean uprob;
  obj *otmp;
  int wt;
  trap *ttmp_local;
  monst *mtmp_local;
  
  bVar7 = false;
  bVar1 = false;
  if ((mtmp->data == mons + 0xdb) && (bVar1 = false, (*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0)) {
    bVar1 = 6 < mtmp->mhp;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) == 0) {
    pcVar5 = Monnam(mtmp);
    pline("%s isn\'t trapped.",pcVar5);
    mtmp_local._4_4_ = 0;
  }
  else {
    bVar2 = check_capacity((char *)0x0);
    if (bVar2 == '\0') {
      iVar3 = untrap_prob(ttmp);
      if ((((char)iVar3 == '\0') || ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0)) ||
         ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0)) {
        if (((mtmp->data == mons + 0xc) || (mtmp->data == mons + 0xb)) &&
           ((uarmg == (obj *)0x0 &&
            ((u.uprops[8].extrinsic == 0 && ((youmonst.mintrinsics & 0x80) == 0)))))) {
          pcVar5 = mons_mname(mtmp->data);
          pcVar6 = body_part(6);
          pcVar6 = makeplural(pcVar6);
          pline("You grab the trapped %s using your bare %s.",pcVar5,pcVar6);
          bVar2 = poly_when_stoned(youmonst.data);
          if ((bVar2 == '\0') || (iVar4 = polymon(0x108), iVar4 == 0)) {
            pcVar5 = mons_mname(mtmp->data);
            pcVar5 = an(pcVar5);
            sprintf(kbuf_1 + 0xf8,"trying to help %s out of a pit",pcVar5);
            delayed_petrify((char *)0x0,kbuf_1 + 0xf8);
            pline("You pull back!");
            return 1;
          }
          (*windowprocs.win_pause)(P_MESSAGE);
        }
        if ((char)iVar3 == '\0') {
          pcVar5 = body_part(0);
          pcVar5 = makeplural(pcVar5);
          pcVar6 = mon_nam(mtmp);
          pline("You reach out your %s and grab %s.",pcVar5,pcVar6);
          if (bVar1) {
            pcVar5 = mons_mname(mtmp->data);
            pcVar5 = an(pcVar5);
            sprintf(local_338,"trying to help %s out of a pit",pcVar5);
            if (uarmg == (obj *)0x0) {
              iVar3 = instadisintegrate(local_338);
              bVar7 = iVar3 != 0;
            }
            else if (((objects[uarmg->otyp].oc_oprop != '\x04') &&
                     (bVar2 = obj_resists(uarmg,5,0x32), bVar2 == '\0')) &&
                    (bVar2 = is_quest_artifact(uarmg), bVar2 == '\0')) {
              destroy_arm(uarmg,'\0');
              iVar3 = instadisintegrate(local_338);
              bVar7 = iVar3 != 0;
            }
          }
          if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) {
            if ((mtmp->mfrozen != '\0') && (iVar3 = rn2((uint)mtmp->mfrozen), iVar3 == 0)) {
              *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffbffff | 0x40000;
              mtmp->mfrozen = '\0';
              pcVar5 = Monnam(mtmp);
              pline("%s stirs.",pcVar5);
            }
          }
          else {
            *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
            pcVar5 = Monnam(mtmp);
            pline("%s awakens.",pcVar5);
          }
          if (bVar7) {
            mtmp_local._4_4_ = 1;
          }
          else {
            iVar3 = inv_weight();
            otmp._4_4_ = iVar3 + (uint)mtmp->data->cwt;
            iVar3 = try_lift(mtmp,ttmp,otmp._4_4_,'\0');
            if (iVar3 == 0) {
              mtmp_local._4_4_ = 1;
            }
            else {
              for (poStack_30 = mtmp->minvent; poStack_30 != (obj *)0x0;
                  poStack_30 = poStack_30->nobj) {
                otmp._4_4_ = poStack_30->owt + otmp._4_4_;
              }
              iVar3 = try_lift(mtmp,ttmp,otmp._4_4_,'\x01');
              if (iVar3 == 0) {
                mtmp_local._4_4_ = 1;
              }
              else {
                pcVar5 = mon_nam(mtmp);
                pline("You pull %s out of the pit.",pcVar5);
                *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xff7fffff;
                fill_pit(level,(int)mtmp->mx,(int)mtmp->my);
                reward_untrap(ttmp,mtmp);
                mtmp_local._4_4_ = 1;
              }
            }
          }
        }
        else {
          if ((bVar1) &&
             ((uarmg == (obj *)0x0 ||
              (((objects[uarmg->otyp].oc_oprop != '\x04' &&
                (bVar2 = obj_resists(uarmg,5,0x32), bVar2 == '\0')) &&
               (bVar2 = is_quest_artifact(uarmg), bVar2 == '\0')))))) {
            pcVar5 = mons_mname(mtmp->data);
            pcVar5 = an(pcVar5);
            sprintf(kbuf_2 + 0xf8,"trying to help %s out of a pit",pcVar5);
            mon_nam(mtmp);
            pline("You try to grab %s, but...");
            if (uarmg == (obj *)0x0) {
              iVar3 = instadisintegrate(kbuf_2 + 0xf8);
              if (iVar3 == 0) {
                pline("You cannot get a firm grasp.");
              }
            }
            else {
              destroy_arm(uarmg,'\0');
            }
          }
          else {
            pcVar5 = mon_nam(mtmp);
            pline("You try to grab %s, but cannot get a firm grasp.",pcVar5);
          }
          if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0) {
            *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
            pcVar5 = Monnam(mtmp);
            pline("%s awakens.",pcVar5);
          }
          mtmp_local._4_4_ = 1;
        }
      }
      else {
        pcVar5 = body_part(0);
        pcVar5 = makeplural(pcVar5);
        pcVar6 = mon_nam(mtmp);
        pline("You try to reach out your %s, but %s backs away skeptically.",pcVar5,pcVar6);
        mtmp_local._4_4_ = 1;
      }
    }
    else {
      mtmp_local._4_4_ = 1;
    }
  }
  return mtmp_local._4_4_;
}

Assistant:

static int help_monster_out(struct monst *mtmp, struct trap *ttmp)
{
	int wt;
	struct obj *otmp;
	boolean uprob;
	boolean udied = FALSE;
	boolean can_disint = (touch_disintegrates(mtmp->data) &&
			      !mtmp->mcan &&
			      mtmp->mhp > 6);

	/*
	 * This works when levitating too -- consistent with the ability
	 * to hit monsters while levitating.
	 *
	 * Should perhaps check that our hero has arms/hands at the
	 * moment.  Helping can also be done by engulfing...
	 *
	 * Test the monster first - monsters are displayed before traps.
	 */
	if (!mtmp->mtrapped) {
		pline("%s isn't trapped.", Monnam(mtmp));
		return 0;
	}
	/* Do you have the necessary capacity to lift anything? */
	if (check_capacity(NULL)) return 1;

	/* Will our hero succeed? */
	if ((uprob = untrap_prob(ttmp)) && !mtmp->msleeping && mtmp->mcanmove) {
		pline("You try to reach out your %s, but %s backs away skeptically.",
			makeplural(body_part(ARM)),
			mon_nam(mtmp));
		return 1;
	}


	/* is it a cockatrice?... */
	if (touch_petrifies(mtmp->data) && !uarmg && !Stone_resistance) {
		pline("You grab the trapped %s using your bare %s.",
				mons_mname(mtmp->data), makeplural(body_part(HAND)));

		if (poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))
			win_pause_output(P_MESSAGE);
		else {
			char kbuf[BUFSZ];

			sprintf(kbuf, "trying to help %s out of a pit",
					an(mons_mname(mtmp->data)));
			delayed_petrify(NULL, kbuf);
			pline("You pull back!");
			return 1;
		}
	}
	/* need to do cockatrice check first if sleeping or paralyzed */
	if (uprob) {
	    if (can_disint && (!(uarmg) || !oresist_disintegration(uarmg))) {
		char kbuf[BUFSZ];
		sprintf(kbuf, "trying to help %s out of a pit",
			an(mons_mname(mtmp->data)));
		pline("You try to grab %s, but...", mon_nam(mtmp));
		if (uarmg) {
		    destroy_arm(uarmg, FALSE);
		} else {
		    if (!instadisintegrate(kbuf))
			pline("You cannot get a firm grasp.");
		}
	    } else {
		pline("You try to grab %s, but cannot get a firm grasp.",
		      mon_nam(mtmp));
	    }
	    if (mtmp->msleeping) {
		mtmp->msleeping = 0;
		pline("%s awakens.", Monnam(mtmp));
	    }
	    return 1;
	}

	pline("You reach out your %s and grab %s.",
	    makeplural(body_part(ARM)), mon_nam(mtmp));

	if (can_disint) {
	    char kbuf[BUFSZ];
	    sprintf(kbuf, "trying to help %s out of a pit",
		    an(mons_mname(mtmp->data)));
	    if (uarmg) {
		if (!oresist_disintegration(uarmg)) {
		    /* The destroy_arm(..., FALSE) could cause problems since
		       that FALSE should be whether the player survives the
		       instadisintegrate() call below it, but in practice it
		       doesn't matter since it destroys gloves and not
		       (potentially petrify-resistant) body armor. */
		    destroy_arm(uarmg, FALSE);
		    udied = instadisintegrate(kbuf) ? 1 : 0;
		}
	    } else {
		udied = (instadisintegrate(kbuf)) ? 1 : 0;
	    }
	}

	if (mtmp->msleeping) {
	    mtmp->msleeping = 0;
	    pline("%s awakens.", Monnam(mtmp));
	} else if (mtmp->mfrozen && !rn2(mtmp->mfrozen)) {
	    /* After such manhandling, perhaps the effect wears off */
	    mtmp->mcanmove = 1;
	    mtmp->mfrozen = 0;
	    pline("%s stirs.", Monnam(mtmp));
	}

	if (udied) return 1;

	/* is the monster too heavy? */
	wt = inv_weight() + mtmp->data->cwt;
	if (!try_lift(mtmp, ttmp, wt, FALSE)) return 1;

	/* is the monster with inventory too heavy? */
	for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		wt += otmp->owt;
	if (!try_lift(mtmp, ttmp, wt, TRUE)) return 1;

	pline("You pull %s out of the pit.", mon_nam(mtmp));
	mtmp->mtrapped = 0;
	fill_pit(level, mtmp->mx, mtmp->my);
	reward_untrap(ttmp, mtmp);
	return 1;
}